

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# record_property_tests.cpp
# Opt level: O2

void __thiscall iu_RecordTest_x_iutest_x_A_Test::Body(iu_RecordTest_x_iutest_x_A_Test *this)

{
  ScopedSPITestFlag SVar1;
  TestFlag *pTVar2;
  TestResult *pTVar3;
  allocator<char> local_1f5;
  ScopedSPITestFlag guard;
  iuCodeMessage local_1f0;
  AssertionResult iutest_spi_ar;
  SPIFailureChecker iutest_failure_checker;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&iutest_failure_checker,"hoge",(allocator<char> *)&local_1f0);
  iutest::Test::RecordProperty<char[2]>((string *)&iutest_failure_checker,(char (*) [2])0x127a88);
  std::__cxx11::string::~string((string *)&iutest_failure_checker);
  iutest::detail::SPIFailureChecker::SPIFailureChecker(&iutest_failure_checker,kNonFatalFailure);
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag(&guard);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f0,"name",&local_1f5);
  iutest::Test::RecordProperty<char[2]>(&local_1f0.m_message,(char (*) [2])0x127a88);
  std::__cxx11::string::~string((string *)&local_1f0);
  SVar1 = guard;
  pTVar2 = iutest::TestFlag::GetInstance();
  pTVar2->m_test_flags = (int)SVar1.super_ScopedGuard.m_test_flags;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f0,"Reserved key",(allocator<char> *)&guard);
  iutest::detail::SPIFailureChecker::GetResult
            (&iutest_spi_ar,&iutest_failure_checker,&local_1f0.m_message);
  std::__cxx11::string::~string((string *)&local_1f0);
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::~Collector(&iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>);
  if (iutest_spi_ar.m_result == false) {
    memset(&iutest_failure_checker,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&iutest_failure_checker);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1f0,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/record_property_tests.cpp"
               ,0x50,iutest_spi_ar.m_message._M_dataplus._M_p);
    local_1f0._44_4_ = 1;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&local_1f0,(Fixed *)&iutest_failure_checker);
    std::__cxx11::string::~string((string *)&local_1f0);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&iutest_failure_checker);
  }
  std::__cxx11::string::~string((string *)&iutest_spi_ar);
  iutest::detail::SPIFailureChecker::SPIFailureChecker(&iutest_failure_checker,kNonFatalFailure);
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag(&guard);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f0,"status",&local_1f5);
  iutest::Test::RecordProperty<char[2]>(&local_1f0.m_message,(char (*) [2])0x127a88);
  std::__cxx11::string::~string((string *)&local_1f0);
  SVar1 = guard;
  pTVar2 = iutest::TestFlag::GetInstance();
  pTVar2->m_test_flags = (int)SVar1.super_ScopedGuard.m_test_flags;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f0,"Reserved key",(allocator<char> *)&guard);
  iutest::detail::SPIFailureChecker::GetResult
            (&iutest_spi_ar,&iutest_failure_checker,&local_1f0.m_message);
  std::__cxx11::string::~string((string *)&local_1f0);
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::~Collector(&iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>);
  if (iutest_spi_ar.m_result == false) {
    memset(&iutest_failure_checker,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&iutest_failure_checker);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1f0,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/record_property_tests.cpp"
               ,0x51,iutest_spi_ar.m_message._M_dataplus._M_p);
    local_1f0._44_4_ = 1;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&local_1f0,(Fixed *)&iutest_failure_checker);
    std::__cxx11::string::~string((string *)&local_1f0);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&iutest_failure_checker);
  }
  std::__cxx11::string::~string((string *)&iutest_spi_ar);
  iutest::detail::SPIFailureChecker::SPIFailureChecker(&iutest_failure_checker,kNonFatalFailure);
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag(&guard);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f0,"time",&local_1f5);
  iutest::Test::RecordProperty<char[2]>(&local_1f0.m_message,(char (*) [2])0x127a88);
  std::__cxx11::string::~string((string *)&local_1f0);
  SVar1 = guard;
  pTVar2 = iutest::TestFlag::GetInstance();
  pTVar2->m_test_flags = (int)SVar1.super_ScopedGuard.m_test_flags;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f0,"Reserved key",(allocator<char> *)&guard);
  iutest::detail::SPIFailureChecker::GetResult
            (&iutest_spi_ar,&iutest_failure_checker,&local_1f0.m_message);
  std::__cxx11::string::~string((string *)&local_1f0);
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::~Collector(&iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>);
  if (iutest_spi_ar.m_result == false) {
    memset(&iutest_failure_checker,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&iutest_failure_checker);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1f0,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/record_property_tests.cpp"
               ,0x52,iutest_spi_ar.m_message._M_dataplus._M_p);
    local_1f0._44_4_ = 1;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&local_1f0,(Fixed *)&iutest_failure_checker);
    std::__cxx11::string::~string((string *)&local_1f0);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&iutest_failure_checker);
  }
  std::__cxx11::string::~string((string *)&iutest_spi_ar);
  iutest::detail::SPIFailureChecker::SPIFailureChecker(&iutest_failure_checker,kNonFatalFailure);
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag(&guard);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f0,"classname",&local_1f5);
  iutest::Test::RecordProperty<char[2]>(&local_1f0.m_message,(char (*) [2])0x127a88);
  std::__cxx11::string::~string((string *)&local_1f0);
  SVar1 = guard;
  pTVar2 = iutest::TestFlag::GetInstance();
  pTVar2->m_test_flags = (int)SVar1.super_ScopedGuard.m_test_flags;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f0,"Reserved key",(allocator<char> *)&guard);
  iutest::detail::SPIFailureChecker::GetResult
            (&iutest_spi_ar,&iutest_failure_checker,&local_1f0.m_message);
  std::__cxx11::string::~string((string *)&local_1f0);
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::~Collector(&iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>);
  if (iutest_spi_ar.m_result == false) {
    memset(&iutest_failure_checker,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&iutest_failure_checker);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1f0,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/record_property_tests.cpp"
               ,0x53,iutest_spi_ar.m_message._M_dataplus._M_p);
    local_1f0._44_4_ = 1;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&local_1f0,(Fixed *)&iutest_failure_checker);
    std::__cxx11::string::~string((string *)&local_1f0);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&iutest_failure_checker);
  }
  std::__cxx11::string::~string((string *)&iutest_spi_ar);
  iutest::detail::SPIFailureChecker::SPIFailureChecker(&iutest_failure_checker,kNonFatalFailure);
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag(&guard);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f0,"type_param",&local_1f5);
  iutest::Test::RecordProperty<char[2]>(&local_1f0.m_message,(char (*) [2])0x127a88);
  std::__cxx11::string::~string((string *)&local_1f0);
  SVar1 = guard;
  pTVar2 = iutest::TestFlag::GetInstance();
  pTVar2->m_test_flags = (int)SVar1.super_ScopedGuard.m_test_flags;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f0,"Reserved key",(allocator<char> *)&guard);
  iutest::detail::SPIFailureChecker::GetResult
            (&iutest_spi_ar,&iutest_failure_checker,&local_1f0.m_message);
  std::__cxx11::string::~string((string *)&local_1f0);
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::~Collector(&iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>);
  if (iutest_spi_ar.m_result == false) {
    memset(&iutest_failure_checker,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&iutest_failure_checker);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1f0,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/record_property_tests.cpp"
               ,0x54,iutest_spi_ar.m_message._M_dataplus._M_p);
    local_1f0._44_4_ = 1;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&local_1f0,(Fixed *)&iutest_failure_checker);
    std::__cxx11::string::~string((string *)&local_1f0);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&iutest_failure_checker);
  }
  std::__cxx11::string::~string((string *)&iutest_spi_ar);
  iutest::detail::SPIFailureChecker::SPIFailureChecker(&iutest_failure_checker,kNonFatalFailure);
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag(&guard);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f0,"value_param",&local_1f5);
  iutest::Test::RecordProperty<char[2]>(&local_1f0.m_message,(char (*) [2])0x127a88);
  std::__cxx11::string::~string((string *)&local_1f0);
  pTVar2 = iutest::TestFlag::GetInstance();
  pTVar2->m_test_flags = (int)guard.super_ScopedGuard.m_test_flags;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f0,"Reserved key",(allocator<char> *)&guard);
  iutest::detail::SPIFailureChecker::GetResult
            (&iutest_spi_ar,&iutest_failure_checker,&local_1f0.m_message);
  std::__cxx11::string::~string((string *)&local_1f0);
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::~Collector(&iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>);
  if (iutest_spi_ar.m_result == false) {
    memset(&iutest_failure_checker,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&iutest_failure_checker);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1f0,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/record_property_tests.cpp"
               ,0x55,iutest_spi_ar.m_message._M_dataplus._M_p);
    local_1f0._44_4_ = 1;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&local_1f0,(Fixed *)&iutest_failure_checker);
    std::__cxx11::string::~string((string *)&local_1f0);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&iutest_failure_checker);
  }
  std::__cxx11::string::~string((string *)&iutest_spi_ar);
  pTVar3 = iuutil::GetCurrentTestResult();
  CheckProperty(pTVar3,"hoge","B");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&iutest_failure_checker,"hoge",(allocator<char> *)&local_1f0);
  iutest::Test::RecordProperty<char[2]>((string *)&iutest_failure_checker,(char (*) [2])0x1265f3);
  std::__cxx11::string::~string((string *)&iutest_failure_checker);
  pTVar3 = iuutil::GetCurrentTestResult();
  CheckProperty(pTVar3,"hoge","b");
  return;
}

Assistant:

IUTEST_F(RecordTest, A)
{
    RecordProperty("hoge", "B");
#if !defined(IUTEST_USE_GTEST)
    // ban list
    IUTEST_EXPECT_NONFATAL_FAILURE( RecordProperty("name"       , "B"), "Reserved key");
    IUTEST_EXPECT_NONFATAL_FAILURE( RecordProperty("status"     , "B"), "Reserved key");
    IUTEST_EXPECT_NONFATAL_FAILURE( RecordProperty("time"       , "B"), "Reserved key");
    IUTEST_EXPECT_NONFATAL_FAILURE( RecordProperty("classname"  , "B"), "Reserved key");
    IUTEST_EXPECT_NONFATAL_FAILURE( RecordProperty("type_param" , "B"), "Reserved key");
    IUTEST_EXPECT_NONFATAL_FAILURE( RecordProperty("value_param", "B"), "Reserved key");
#endif
    CheckProperty(::iuutil::GetCurrentTestResult(), "hoge", "B");

    // overwrite
    RecordProperty("hoge", "b");
    CheckProperty(::iuutil::GetCurrentTestResult(), "hoge", "b");
}